

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_token_tree.cpp
# Opt level: O3

void __thiscall duckdb::WindowTokenTree::CleanupSort(WindowTokenTree *this)

{
  GlobalSortStatePtr *pGVar1;
  byte bVar2;
  ClientContext *pCVar3;
  byte *pbVar4;
  pointer puVar5;
  WindowTokenTree *this_00;
  pointer this_01;
  type pGVar6;
  pointer pGVar7;
  reference pvVar8;
  reference pvVar9;
  pointer this_02;
  reference pvVar10;
  data_ptr_t pdVar11;
  value_type vVar12;
  value_type vVar13;
  uchar *d;
  byte *pbVar14;
  ulong uVar15;
  PayloadScanner scanner;
  DataChunk payload_chunk;
  PayloadScanner local_98;
  reference local_80;
  WindowTokenTree *local_78;
  DataChunk local_70;
  
  local_78 = this;
  if ((this->super_WindowMergeSortTree).mst64.
      super_unique_ptr<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>_>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>_*,_std::default_delete<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>_>_>
      .
      super__Head_base<0UL,_duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>_*,_false>
      ._M_head_impl ==
      (MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL> *)0x0) {
    this_02 = unique_ptr<duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>_>,_true>
              ::operator->(&(this->super_WindowMergeSortTree).mst32);
    local_80 = vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_true>
               ::operator[](&this_02->tree,0);
    pGVar1 = &(this->super_WindowMergeSortTree).global_sort;
    pGVar6 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
             ::operator*(pGVar1);
    PayloadScanner::PayloadScanner(&local_98,pGVar6,true);
    DataChunk::DataChunk(&local_70);
    pCVar3 = (this->super_WindowMergeSortTree).context;
    pGVar7 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
             ::operator->(pGVar1);
    DataChunk::Initialize(&local_70,pCVar3,&(pGVar7->payload_layout).types,0x800);
    pbVar14 = (this->deltas).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    pbVar4 = (this->deltas).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pbVar14 != pbVar4) {
      vVar12 = 0;
      uVar15 = 0;
      pdVar11 = (data_ptr_t)0x0;
      do {
        if (local_70.count <= uVar15) {
          DataChunk::Reset(&local_70);
          PayloadScanner::Scan(&local_98,&local_70);
          if (local_70.count == 0) break;
          pvVar8 = vector<duckdb::Vector,_true>::operator[](&local_70.data,0);
          pdVar11 = pvVar8->data;
          uVar15 = 0;
        }
        bVar2 = *pbVar14;
        pvVar10 = vector<unsigned_int,_true>::operator[]
                            (&local_80->first,(ulong)*(uint *)(pdVar11 + uVar15 * 4));
        uVar15 = uVar15 + 1;
        vVar12 = vVar12 + bVar2;
        *pvVar10 = vVar12;
        pbVar14 = pbVar14 + 1;
      } while (pbVar14 != pbVar4);
    }
  }
  else {
    this_01 = unique_ptr<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>_>,_true>
              ::operator->(&(this->super_WindowMergeSortTree).mst64);
    local_80 = (reference)
               vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
               ::operator[](&this_01->tree,0);
    pGVar1 = &(this->super_WindowMergeSortTree).global_sort;
    pGVar6 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
             ::operator*(pGVar1);
    PayloadScanner::PayloadScanner(&local_98,pGVar6,true);
    DataChunk::DataChunk(&local_70);
    pCVar3 = (this->super_WindowMergeSortTree).context;
    pGVar7 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
             ::operator->(pGVar1);
    DataChunk::Initialize(&local_70,pCVar3,&(pGVar7->payload_layout).types,0x800);
    pbVar14 = (this->deltas).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    pbVar4 = (this->deltas).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pbVar14 != pbVar4) {
      vVar13 = 0;
      uVar15 = 0;
      pdVar11 = (data_ptr_t)0x0;
      do {
        if (local_70.count <= uVar15) {
          DataChunk::Reset(&local_70);
          PayloadScanner::Scan(&local_98,&local_70);
          if (local_70.count == 0) break;
          pvVar8 = vector<duckdb::Vector,_true>::operator[](&local_70.data,0);
          pdVar11 = pvVar8->data;
          uVar15 = 0;
        }
        bVar2 = *pbVar14;
        pvVar9 = vector<unsigned_long,_true>::operator[]
                           ((vector<unsigned_long,_true> *)local_80,
                            *(size_type *)(pdVar11 + uVar15 * 8));
        vVar13 = vVar13 + bVar2;
        uVar15 = uVar15 + 1;
        *pvVar9 = vVar13;
        pbVar14 = pbVar14 + 1;
      } while (pbVar14 != pbVar4);
    }
  }
  DataChunk::~DataChunk(&local_70);
  if ((_Head_base<0UL,_duckdb::RowDataCollectionScanner_*,_false>)
      local_98.scanner.
      super_unique_ptr<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::RowDataCollectionScanner_*,_std::default_delete<duckdb::RowDataCollectionScanner>_>
      .super__Head_base<0UL,_duckdb::RowDataCollectionScanner_*,_false>._M_head_impl !=
      (_Head_base<0UL,_duckdb::RowDataCollectionScanner_*,_false>)0x0) {
    RowDataCollectionScanner::~RowDataCollectionScanner
              ((RowDataCollectionScanner *)
               local_98.scanner.
               super_unique_ptr<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::RowDataCollectionScanner_*,_std::default_delete<duckdb::RowDataCollectionScanner>_>
               .super__Head_base<0UL,_duckdb::RowDataCollectionScanner_*,_false>._M_head_impl);
    operator_delete((void *)local_98.scanner.
                            super_unique_ptr<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::RowDataCollectionScanner_*,_std::default_delete<duckdb::RowDataCollectionScanner>_>
                            .super__Head_base<0UL,_duckdb::RowDataCollectionScanner_*,_false>.
                            _M_head_impl);
  }
  local_98.scanner.
  super_unique_ptr<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::RowDataCollectionScanner_*,_std::default_delete<duckdb::RowDataCollectionScanner>_>
  .super__Head_base<0UL,_duckdb::RowDataCollectionScanner_*,_false>._M_head_impl =
       (unique_ptr<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
        )(__uniq_ptr_data<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>,_true,_true>
          )0x0;
  if (local_98.heap.
      super_unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::RowDataCollection_*,_std::default_delete<duckdb::RowDataCollection>_>
      .super__Head_base<0UL,_duckdb::RowDataCollection_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true,_true>
       )0x0) {
    ::std::vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>::~vector
              ((vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_> *)
               ((long)local_98.heap.
                      super_unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
                      ._M_t.
                      super___uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_duckdb::RowDataCollection_*,_std::default_delete<duckdb::RowDataCollection>_>
                      .super__Head_base<0UL,_duckdb::RowDataCollection_*,_false>._M_head_impl + 0x38
               ));
    ::std::
    vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
               *)((long)local_98.heap.
                        super_unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
                        ._M_t.
                        super___uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_duckdb::RowDataCollection_*,_std::default_delete<duckdb::RowDataCollection>_>
                        .super__Head_base<0UL,_duckdb::RowDataCollection_*,_false>._M_head_impl +
                 0x20));
    operator_delete((void *)local_98.heap.
                            super_unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::RowDataCollection_*,_std::default_delete<duckdb::RowDataCollection>_>
                            .super__Head_base<0UL,_duckdb::RowDataCollection_*,_false>._M_head_impl)
    ;
  }
  this_00 = local_78;
  local_98.heap.
  super_unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>._M_t.
  super___uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::RowDataCollection_*,_std::default_delete<duckdb::RowDataCollection>_>
  .super__Head_base<0UL,_duckdb::RowDataCollection_*,_false>._M_head_impl =
       (unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>)
       (__uniq_ptr_data<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true,_true>
        )0x0;
  if (local_98.rows.
      super_unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::RowDataCollection_*,_std::default_delete<duckdb::RowDataCollection>_>
      .super__Head_base<0UL,_duckdb::RowDataCollection_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true,_true>
       )0x0) {
    ::std::vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>::~vector
              ((vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_> *)
               ((long)local_98.rows.
                      super_unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
                      ._M_t.
                      super___uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_duckdb::RowDataCollection_*,_std::default_delete<duckdb::RowDataCollection>_>
                      .super__Head_base<0UL,_duckdb::RowDataCollection_*,_false>._M_head_impl + 0x38
               ));
    ::std::
    vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
               *)((long)local_98.rows.
                        super_unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
                        ._M_t.
                        super___uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_duckdb::RowDataCollection_*,_std::default_delete<duckdb::RowDataCollection>_>
                        .super__Head_base<0UL,_duckdb::RowDataCollection_*,_false>._M_head_impl +
                 0x20));
    operator_delete((void *)local_98.rows.
                            super_unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::RowDataCollection_*,_std::default_delete<duckdb::RowDataCollection>_>
                            .super__Head_base<0UL,_duckdb::RowDataCollection_*,_false>._M_head_impl)
    ;
  }
  puVar5 = (this_00->deltas).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this_00->deltas).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this_00->deltas).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this_00->deltas).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  WindowMergeSortTree::CleanupSort(&this_00->super_WindowMergeSortTree);
  if (puVar5 != (pointer)0x0) {
    operator_delete(puVar5);
  }
  return;
}

Assistant:

void WindowTokenTree::CleanupSort() {
	//	Convert the deltas to tokens
	if (mst64) {
		BuildTokens(*this, mst64->LowestLevel());
	} else {
		BuildTokens(*this, mst32->LowestLevel());
	}

	// Deallocate memory
	vector<uint8_t> empty;
	deltas.swap(empty);

	WindowMergeSortTree::CleanupSort();
}